

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptorTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSocketAcceptorTests::receivePartialMessageFixture::receivePartialMessageFixture
          (receivePartialMessageFixture *this)

{
  int __fd;
  int iVar1;
  SocketAcceptor *this_00;
  string input;
  SessionSettings settings;
  stringstream stream;
  int local_274;
  long *local_270 [2];
  long local_260 [2];
  sockaddr local_250;
  SessionSettings local_240;
  stringstream local_1b0 [128];
  ios_base local_130 [264];
  
  (this->application).super_NullApplication.super_Application._vptr_Application =
       (_func_int **)&PTR__Application_0032e568;
  *(code **)&this->factory = FIX::SocketServer::accept;
  local_240.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240.m_settings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_240.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_240.m_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240.m_defaults._vptr_Dictionary = (_func_int **)&PTR__Dictionary_003262d8;
  local_240.m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_240.m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
  local_240.m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_240.m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_240.m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_240.m_defaults.m_name._M_dataplus._M_p = (pointer)&local_240.m_defaults.m_name.field_2;
  local_240.m_defaults.m_name._M_string_length = 0;
  local_240.m_defaults.m_name.field_2._M_local_buf[0] = '\0';
  local_240.m_resolveEnvVars = false;
  local_270[0] = local_260;
  local_240.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_240.m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_240.m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,
             "[DEFAULT]\nConnectionType=acceptor\nSocketAcceptPort=5000\nSocketReuseAddress=Y\nSendBufferSize=1024\nReceiveBufferSize=1024\nStartTime=00:00:00\nEndTime=00:00:00\nUseDataDictionary=N\nCheckLatency=N\n[SESSION]\nBeginString=FIX.4.2\nSenderCompID=ISLD\nTargetCompID=TW\n[SESSION]\nBeginString=FIX.4.1\nSenderCompID=ISLD\nTargetCompID=WT\n"
             ,"");
  std::__cxx11::stringstream::stringstream(local_1b0,(string *)local_270,_S_out|_S_in);
  FIX::operator>>((istream *)local_1b0,&local_240);
  this_00 = (SocketAcceptor *)operator_new(0x1a0);
  FIX::SocketAcceptor::SocketAcceptor
            (this_00,(Application *)this,(MessageStoreFactory *)&this->factory,&local_240);
  this->object = this_00;
  FIX::Acceptor::poll(0.0);
  __fd = socket(2,1,6);
  local_250.sa_family = 2;
  local_250.sa_data[0] = '\x13';
  local_250.sa_data[1] = -0x78;
  local_250.sa_data._2_4_ = inet_addr("127.0.0.1");
  iVar1 = connect(__fd,&local_250,0x10);
  if (iVar1 != 0) {
    local_274 = __fd;
    FIX::socket_close(__fd);
    FIX::socket_invalidate(&local_274);
    __fd = -1;
  }
  this->s = __fd;
  FIX::Acceptor::poll(0.0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  FIX::Dictionary::~Dictionary(&local_240.m_defaults);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
               *)&local_240);
  return;
}

Assistant:

receivePartialMessageFixture()
  {
    SessionSettings settings;
    std::string input =
      "[DEFAULT]\n"
      "ConnectionType=acceptor\n"
      "SocketAcceptPort=5000\n"
      "SocketReuseAddress=Y\n"
      "SendBufferSize=1024\n"
      "ReceiveBufferSize=1024\n"
      "StartTime=00:00:00\n"
      "EndTime=00:00:00\n"
      "UseDataDictionary=N\n"
      "CheckLatency=N\n"
      "[SESSION]\n"
      "BeginString=FIX.4.2\n"
      "SenderCompID=ISLD\n"
      "TargetCompID=TW\n"
      "[SESSION]\n"
      "BeginString=FIX.4.1\n"
      "SenderCompID=ISLD\n"
      "TargetCompID=WT\n";
    std::stringstream stream( input );
    stream >> settings;

    object = new SocketAcceptor( application, factory, settings );
    object->poll();
    s = createSocket( 5000, "127.0.0.1" );
    object->poll();
  }